

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O2

void __thiscall QSqlRelationalTableModelPrivate::clearChanges(QSqlRelationalTableModelPrivate *this)

{
  iterator iVar1;
  iterator iVar2;
  QSharedPointer<QRelation> *rel;
  
  iVar1 = QList<QSharedPointer<QRelation>_>::begin(&this->relations);
  iVar2 = QList<QSharedPointer<QRelation>_>::end(&this->relations);
  for (; iVar1.i != iVar2.i; iVar1.i = iVar1.i + 1) {
    QRelation::clear(((iVar1.i)->value).ptr);
  }
  return;
}

Assistant:

void QSqlRelationalTableModelPrivate::clearChanges()
{
    for (auto &rel : relations)
        rel->clear();
}